

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackIFWCommon *this_00;
  cmCPackLog *pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  string *r;
  _Alloc_hider repositoryName;
  allocator<char> local_249;
  string sysName;
  allocator<char> local_219;
  string local_218;
  string FrameworkVersionOpt;
  string RepoGenOpt;
  string BinCreatorOpt;
  string exeSuffix;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&BinCreatorOpt,"CPACK_IFW_BINARYCREATOR_EXECUTABLE",
             (allocator<char> *)&exeSuffix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&RepoGenOpt,"CPACK_IFW_REPOGEN_EXECUTABLE",(allocator<char> *)&exeSuffix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&FrameworkVersionOpt,"CPACK_IFW_FRAMEWORK_VERSION",
             (allocator<char> *)&exeSuffix);
  bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&BinCreatorOpt);
  if (((!bVar3) ||
      (bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&RepoGenOpt), !bVar3)) ||
     (bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&FrameworkVersionOpt), !bVar3))
  {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  this_00 = &this->super_cmCPackIFWCommon;
  pcVar5 = cmCPackIFWCommon::GetOption(this_00,&BinCreatorOpt);
  if ((pcVar5 == (char *)0x0) || (bVar3 = cmSystemTools::IsNOTFOUND((char *)0x15408f), bVar3)) {
    (this->BinCreator)._M_string_length = 0;
    *(this->BinCreator)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((char *)&this->BinCreator);
  }
  if ((this->BinCreator)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&exeSuffix);
    poVar6 = std::operator<<((ostream *)&exeSuffix,
                             "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar1 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x10a,sysName._M_dataplus._M_p);
LAB_00154543:
      std::__cxx11::string::~string((string *)&sysName);
    }
  }
  else {
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&RepoGenOpt);
    if ((pcVar5 == (char *)0x0) || (bVar3 = cmSystemTools::IsNOTFOUND((char *)0x1540e0), bVar3)) {
      (this->RepoGen)._M_string_length = 0;
      *(this->RepoGen)._M_dataplus._M_p = '\0';
    }
    else {
      std::__cxx11::string::assign((char *)&this->RepoGen);
    }
    cmCPackIFWCommon::GetOption(this_00,&FrameworkVersionOpt);
    std::__cxx11::string::assign((char *)&this->FrameworkVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exeSuffix,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES",(allocator<char> *)&sysName)
    ;
    bVar3 = cmCPackIFWCommon::IsOn(this_00,&exeSuffix);
    this->ResolveDuplicateNames = bVar3;
    std::__cxx11::string::~string((string *)&exeSuffix);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->PkgsDirsVector);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exeSuffix,"CPACK_IFW_PACKAGES_DIRECTORIES",(allocator<char> *)&sysName);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&exeSuffix);
    std::__cxx11::string::~string((string *)&exeSuffix);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&exeSuffix,pcVar5,(allocator<char> *)&sysName);
      cmSystemTools::ExpandListArgument(&exeSuffix,&this->PkgsDirsVector,false);
      std::__cxx11::string::~string((string *)&exeSuffix);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->RepoDirsVector);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exeSuffix,"CPACK_IFW_REPOSITORIES_DIRECTORIES",(allocator<char> *)&sysName
              );
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&exeSuffix);
    std::__cxx11::string::~string((string *)&exeSuffix);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&exeSuffix,pcVar5,(allocator<char> *)&sysName);
      cmSystemTools::ExpandListArgument(&exeSuffix,&this->RepoDirsVector,false);
      std::__cxx11::string::~string((string *)&exeSuffix);
    }
    (this->Installer).super_cmCPackIFWCommon.Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    (this->Repository).super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::assign((char *)&(this->Repository).Name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exeSuffix,"CPACK_DOWNLOAD_SITE",(allocator<char> *)&sysName);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&exeSuffix);
    std::__cxx11::string::~string((string *)&exeSuffix);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&(this->Repository).Url);
      exeSuffix._M_dataplus._M_p = (pointer)&this->Repository;
      std::vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>>::
      emplace_back<cmCPackIFWRepository*>
                ((vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *)
                 &(this->Installer).RemoteRepositories,(cmCPackIFWRepository **)&exeSuffix);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exeSuffix,"CPACK_IFW_REPOSITORIES_ALL",(allocator<char> *)&sysName);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&exeSuffix);
    std::__cxx11::string::~string((string *)&exeSuffix);
    if (pcVar5 != (char *)0x0) {
      sysName._M_dataplus._M_p = (pointer)0x0;
      sysName._M_string_length = 0;
      sysName.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&exeSuffix,pcVar5,(allocator<char> *)&local_218);
      cmSystemTools::ExpandListArgument
                (&exeSuffix,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&sysName,false);
      std::__cxx11::string::~string((string *)&exeSuffix);
      sVar2 = sysName._M_string_length;
      for (repositoryName = sysName._M_dataplus; repositoryName._M_p != (pointer)sVar2;
          repositoryName._M_p = repositoryName._M_p + 0x20) {
        GetRepository(this,(string *)repositoryName._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sysName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exeSuffix,"CPACK_IFW_DOWNLOAD_ALL",(allocator<char> *)&sysName);
    pcVar5 = cmCPackIFWCommon::GetOption(this_00,&exeSuffix);
    std::__cxx11::string::~string((string *)&exeSuffix);
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&exeSuffix,"CPACK_DOWNLOAD_ALL",(allocator<char> *)&sysName);
      pcVar5 = cmCPackIFWCommon::GetOption(this_00,&exeSuffix);
      std::__cxx11::string::~string((string *)&exeSuffix);
      if (pcVar5 != (char *)0x0) {
        bVar3 = cmSystemTools::IsOn(pcVar5);
        goto LAB_001544b5;
      }
      this->OnlineOnly = false;
    }
    else {
      bVar3 = cmSystemTools::IsOn(pcVar5);
LAB_001544b5:
      this->OnlineOnly = bVar3;
    }
    if (((this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_start ==
         (this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_finish) || ((this->RepoGen)._M_string_length != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sysName,"CMAKE_EXECUTABLE_SUFFIX",(allocator<char> *)&local_218);
      pcVar5 = cmCPackIFWCommon::GetOption(this_00,&sysName);
      std::__cxx11::string::string<std::allocator<char>>((string *)&exeSuffix,pcVar5,&local_249);
      std::__cxx11::string::~string((string *)&sysName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"CMAKE_SYSTEM_NAME",&local_249);
      pcVar5 = cmCPackIFWCommon::GetOption(this_00,&local_218);
      std::__cxx11::string::string<std::allocator<char>>((string *)&sysName,pcVar5,&local_219);
      std::__cxx11::string::~string((string *)&local_218);
      bVar3 = std::operator==(&sysName,"Linux");
      if ((bVar3) || (bVar3 = std::operator==(&sysName,"Windows"), bVar3)) {
LAB_0015465f:
        std::__cxx11::string::assign((char *)&this->ExecutableSuffix);
      }
      else {
        bVar3 = std::operator==(&sysName,"Darwin");
        if (bVar3) goto LAB_0015465f;
        std::__cxx11::string::_M_assign((string *)&this->ExecutableSuffix);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"CPACK_IFW_PACKAGE_FILE_EXTENSION",&local_249);
      pcVar5 = cmCPackIFWCommon::GetOption(this_00,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      if ((pcVar5 != (char *)0x0) || (bVar3 = std::operator==(&sysName,"Darwin"), bVar3)) {
        std::__cxx11::string::assign((char *)&this->OutputExtension);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->OutputExtension);
      }
      if ((this->OutputExtension)._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&this->OutputExtension);
      }
      iVar4 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      std::__cxx11::string::~string((string *)&sysName);
      std::__cxx11::string::~string((string *)&exeSuffix);
      goto LAB_00154706;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&exeSuffix);
    poVar6 = std::operator<<((ostream *)&exeSuffix,
                             "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar1 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x153,sysName._M_dataplus._M_p);
      goto LAB_00154543;
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&exeSuffix);
  iVar4 = 0;
LAB_00154706:
  std::__cxx11::string::~string((string *)&FrameworkVersionOpt);
  std::__cxx11::string::~string((string *)&RepoGenOpt);
  std::__cxx11::string::~string((string *)&BinCreatorOpt);
  return iVar4;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";
  const std::string FrameworkVersionOpt = "CPACK_IFW_FRAMEWORK_VERSION";

  if (!this->IsSet(BinCreatorOpt) || !this->IsSet(RepoGenOpt) ||
      !this->IsSet(FrameworkVersionOpt)) {
    this->ReadListFile("CPackIFW.cmake");
  }

  // Look 'binarycreator' executable (needs)

  const char* BinCreatorStr = this->GetOption(BinCreatorOpt);
  if (!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr)) {
    this->BinCreator.clear();
  } else {
    this->BinCreator = BinCreatorStr;
  }

  if (this->BinCreator.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW compiler \"binarycreator\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Look 'repogen' executable (optional)

  const char* RepoGenStr = this->GetOption(RepoGenOpt);
  if (!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr)) {
    this->RepoGen.clear();
  } else {
    this->RepoGen = RepoGenStr;
  }

  // Framework version
  if (const char* FrameworkVersionSrt = this->GetOption(FrameworkVersionOpt)) {
    this->FrameworkVersion = FrameworkVersionSrt;
  } else {
    this->FrameworkVersion = "1.9.9";
  }

  // Variables that Change Behavior

  // Resolve duplicate names
  this->ResolveDuplicateNames =
    this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  this->PkgsDirsVector.clear();
  if (const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->PkgsDirsVector);
  }

  // Additional repositories dirs
  this->RepoDirsVector.clear();
  if (const char* dirs =
        this->GetOption("CPACK_IFW_REPOSITORIES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->RepoDirsVector);
  }

  // Installer
  this->Installer.Generator = this;
  this->Installer.ConfigureFromOptions();

  // Repository
  this->Repository.Generator = this;
  this->Repository.Name = "Unspecified";
  if (const char* site = this->GetOption("CPACK_DOWNLOAD_SITE")) {
    this->Repository.Url = site;
    this->Installer.RemoteRepositories.push_back(&this->Repository);
  }

  // Repositories
  if (const char* RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL")) {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr, RepoAllVector);
    for (std::string const& r : RepoAllVector) {
      this->GetRepository(r);
    }
  }

  if (const char* ifwDownloadAll = this->GetOption("CPACK_IFW_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
  } else if (const char* cpackDownloadAll =
               this->GetOption("CPACK_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
  } else {
    this->OnlineOnly = false;
  }

  if (!this->Installer.RemoteRepositories.empty() && this->RepoGen.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW repository generator \"repogen\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Executable suffix
  std::string exeSuffix(this->GetOption("CMAKE_EXECUTABLE_SUFFIX"));
  std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
  if (sysName == "Linux") {
    this->ExecutableSuffix = ".run";
  } else if (sysName == "Windows") {
    this->ExecutableSuffix = ".exe";
  } else if (sysName == "Darwin") {
    this->ExecutableSuffix = ".app";
  } else {
    this->ExecutableSuffix = exeSuffix;
  }

  // Output extension
  if (const char* optOutExt =
        this->GetOption("CPACK_IFW_PACKAGE_FILE_EXTENSION")) {
    this->OutputExtension = optOutExt;
  } else if (sysName == "Darwin") {
    this->OutputExtension = ".dmg";
  } else {
    this->OutputExtension = this->ExecutableSuffix;
  }
  if (this->OutputExtension.empty()) {
    this->OutputExtension = this->cmCPackGenerator::GetOutputExtension();
  }

  return this->Superclass::InitializeInternal();
}